

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O2

void Ivy_GraphPrepare(Dec_Graph_t *pGraph,Ivy_Cut_t *pCut,Vec_Ptr_t *vFanins,char *pPerm)

{
  Dec_Node_t *pDVar1;
  int iVar2;
  void *pvVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar3;
  
  iVar2 = pGraph->nLeaves;
  if (iVar2 != pCut->nSize) {
    __assert_fail("Dec_GraphLeaveNum(pGraph) == pCut->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivySeq.c"
                  ,0x170,"void Ivy_GraphPrepare(Dec_Graph_t *, Ivy_Cut_t *, Vec_Ptr_t *, char *)");
  }
  if (vFanins->nSize == iVar2) {
    lVar6 = 0x10;
    for (lVar11 = 0; lVar3 = (long)iVar2, lVar11 < lVar3; lVar11 = lVar11 + 1) {
      pDVar1 = pGraph->pNodes;
      pvVar4 = Vec_PtrEntry(vFanins,(int)lVar11);
      *(void **)((long)pDVar1 + lVar6 + -8) = pvVar4;
      *(uint *)(&(pDVar1->eEdge0).field_0x0 + lVar6) =
           *(uint *)(&(pDVar1->eEdge0).field_0x0 + lVar6) & 0x7ffffff |
           pCut->pArray[pPerm[lVar11]] << 0x1b;
      iVar2 = pGraph->nLeaves;
      lVar6 = lVar6 + 0x18;
    }
    lVar6 = lVar3 * 0x18 + 0x10;
    for (; lVar3 < pGraph->nSize; lVar3 = lVar3 + 1) {
      pDVar1 = pGraph->pNodes;
      uVar7 = *(uint *)((long)pDVar1 + lVar6 + -0x10) >> 1 & 0x3fffffff;
      uVar9 = *(uint *)((long)pDVar1 + lVar6 + -0xc) >> 1 & 0x3fffffff;
      uVar8 = *(uint *)&pDVar1[uVar7].field_0x10 >> 0x1b;
      uVar10 = *(uint *)&pDVar1[uVar9].field_0x10 >> 0x1b;
      if (uVar8 < uVar10) {
        uVar10 = uVar8;
      }
      uVar5 = uVar10 << 0x1b;
      uVar8 = *(uint *)(&(pDVar1->eEdge0).field_0x0 + lVar6);
      *(uint *)(&(pDVar1->eEdge0).field_0x0 + lVar6) = uVar8 & 0x7ffffff | uVar5;
      uVar7 = ((*(uint *)&pDVar1[uVar7].field_0x10 >> 0x1b) - uVar10 & 0x1f) << 0x11;
      *(uint *)(&(pDVar1->eEdge0).field_0x0 + lVar6) = uVar8 & 0x7c1ffff | uVar5 | uVar7;
      *(uint *)(&(pDVar1->eEdge0).field_0x0 + lVar6) =
           uVar8 & 0x1ffff | uVar5 | uVar7 |
           ((*(uint *)&pDVar1[uVar9].field_0x10 >> 0x1b) - uVar10 & 0x1f) << 0x16;
      lVar6 = lVar6 + 0x18;
    }
    return;
  }
  __assert_fail("Vec_PtrSize(vFanins) == pCut->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivySeq.c"
                ,0x171,"void Ivy_GraphPrepare(Dec_Graph_t *, Ivy_Cut_t *, Vec_Ptr_t *, char *)");
}

Assistant:

void Ivy_GraphPrepare( Dec_Graph_t * pGraph, Ivy_Cut_t * pCut, Vec_Ptr_t * vFanins, char * pPerm )
{
    Dec_Node_t * pNode, * pNode0, * pNode1;
    int i;
    assert( Dec_GraphLeaveNum(pGraph) == pCut->nSize );
    assert( Vec_PtrSize(vFanins) == pCut->nSize );
    // label the leaves with latch numbers
    Dec_GraphForEachLeaf( pGraph, pNode, i )
    {
        pNode->pFunc = Vec_PtrEntry( vFanins, i );
        pNode->nLat2 = Ivy_LeafLat( pCut->pArray[(int)pPerm[i]] );
    }
    // propagate latches through the nodes
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        // get the children of this node
        pNode0 = Dec_GraphNode( pGraph, pNode->eEdge0.Node );
        pNode1 = Dec_GraphNode( pGraph, pNode->eEdge1.Node );
        // distribute the latches
        pNode->nLat2 = IVY_MIN( pNode0->nLat2, pNode1->nLat2 );
        pNode->nLat0 = pNode0->nLat2 - pNode->nLat2;
        pNode->nLat1 = pNode1->nLat2 - pNode->nLat2;
    }
}